

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O1

opj_bool check_EPHuse(int coff,opj_marker_info_t *markers,int marknum,opj_cio_t *cio)

{
  int pos;
  uint uVar1;
  long lVar2;
  
  if (0 < marknum) {
    lVar2 = 0;
    do {
      if (*(short *)((long)&markers->type + lVar2) == -0xae) {
        pos = cio_tell(cio);
        cio_seek(cio,coff + *(int *)((long)&markers->pos + lVar2) + 2);
        uVar1 = cio_read(cio,1);
        cio_seek(cio,pos);
        return uVar1 >> 2 & 1;
      }
      lVar2 = lVar2 + 0x18;
    } while ((ulong)(uint)marknum * 0x18 != lVar2);
  }
  return 0;
}

Assistant:

opj_bool check_EPHuse( int coff, opj_marker_info_t *markers, int marknum, opj_cio_t *cio)
{
  opj_bool EPHused = OPJ_FALSE;
  int i=0;
  int org_pos;
  unsigned int Scod;

  for(i = 0; i < marknum; i++){
    if( markers[i].type == J2K_MS_COD){
      org_pos = cio_tell( cio);
      cio_seek( cio, coff+markers[i].pos+2);
      
      Scod = cio_read( cio, 1);
      if( ((Scod >> 2) & 1))
	EPHused = OPJ_TRUE;
      cio_seek( cio, org_pos);

      break;
    }
  }    
  return EPHused;
}